

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool __thiscall testing::internal::ExpectationBase::IsOverSaturated(ExpectationBase *this)

{
  bool bVar1;
  ExpectationBase *in_RDI;
  MutexBase *in_stack_00000020;
  int in_stack_ffffffffffffffec;
  
  MutexBase::AssertHeld(in_stack_00000020);
  cardinality(in_RDI);
  bVar1 = Cardinality::IsOverSaturatedByCallCount((Cardinality *)in_RDI,in_stack_ffffffffffffffec);
  return bVar1;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return cardinality().IsOverSaturatedByCallCount(call_count_);
  }